

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O2

void __thiscall
customUnits_uniquenesspersecond_Test::TestBody(customUnits_uniquenesspersecond_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *in_R9;
  uint16_t code;
  precise_unit pVar6;
  ushort local_ba;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  AssertionResult gtest_ar_;
  precise_unit cunit2adj;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  precise_unit cunit1;
  precise_unit cunit1adj;
  
  local_ba = 0;
  do {
    if (0x3ff < local_ba) {
      return;
    }
    cunit1 = units::precise::generate_custom_unit(local_ba);
    cunit1adj = units::precise_unit::operator/(&cunit1,(precise_unit *)units::precise::s);
    cunit2adj.multiplier_._0_4_ = cunit1adj.base_units_;
    iVar2 = units::precise::custom::custom_unit_number((unit_data *)&cunit2adj);
    gtest_ar_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)&gtest_ar,"precise::custom::custom_unit_number(cunit1adj.base_units())",
               "ii",(int *)&gtest_ar_,&local_ba);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&cunit2adj,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x42e,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&cunit2adj,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cunit2adj);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    pVar6 = units::precise_unit::inv(&cunit1adj);
    cunit2adj.multiplier_._0_4_ = pVar6.base_units_;
    iVar2 = units::precise::custom::custom_unit_number((unit_data *)&cunit2adj);
    gtest_ar_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              ((internal *)&gtest_ar,
               "precise::custom::custom_unit_number(cunit1adj.inv().base_units())","ii",
               (int *)&gtest_ar_,&local_ba);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&cunit2adj,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x431,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&cunit2adj,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cunit2adj);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (((uint)cunit1.base_units_ & 0x180000) == 0x100000) {
      uVar3 = ((int)cunit1.base_units_ << 0x12) >> 0x1d;
      uVar4 = -uVar3;
      if (0 < (int)uVar3) {
        uVar4 = uVar3;
      }
      gtest_ar_.success_ = 1 < uVar4;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if (uVar4 < 2) goto LAB_0013ff85;
    }
    else {
      gtest_ar_._0_8_ = gtest_ar_._1_8_ << 8;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
LAB_0013ff85:
      testing::Message::Message((Message *)&cunit2adj);
      std::operator<<((ostream *)((long)cunit2adj.multiplier_ + 0x10),
                      "Error with custom unit/s detection ");
      std::ostream::operator<<((void *)((long)cunit2adj.multiplier_ + 0x10),local_ba);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x432,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&cunit2adj)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (cunit2adj.multiplier_ != 0.0) {
        (**(code **)(*(long *)cunit2adj.multiplier_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    if (((uint)cunit1adj.base_units_ & 0x180000) == 0x100000) {
      uVar3 = ((int)cunit1adj.base_units_ << 0x12) >> 0x1d;
      uVar4 = -uVar3;
      if (0 < (int)uVar3) {
        uVar4 = uVar3;
      }
      gtest_ar_.success_ = 1 < uVar4;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if (uVar4 < 2) goto LAB_0014006d;
    }
    else {
      gtest_ar_._0_8_ = gtest_ar_._1_8_ << 8;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
LAB_0014006d:
      testing::Message::Message((Message *)&cunit2adj);
      std::operator<<((ostream *)((long)cunit2adj.multiplier_ + 0x10),
                      "Error with custom unit/s detection of inverse ");
      std::ostream::operator<<((void *)((long)cunit2adj.multiplier_ + 0x10),local_ba);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1adj.base_units())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x434,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&cunit2adj)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (cunit2adj.multiplier_ != 0.0) {
        (**(code **)(*(long *)cunit2adj.multiplier_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    code = 0;
    while( true ) {
      if (code == 0x400) break;
      if (code != local_ba) {
        gtest_ar_ = (AssertionResult)units::precise::generate_custom_unit(code);
        cunit2adj = units::precise_unit::operator/
                              ((precise_unit *)&gtest_ar_,(precise_unit *)units::precise::s);
        bVar1 = units::precise_unit::operator==(&cunit1,&cunit2adj);
        gtest_ar__2.success_ = !bVar1;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar__2.success_) {
          testing::Message::Message((Message *)&local_b8);
          std::operator<<((ostream *)(local_b8._M_head_impl + 0x10),
                          "Error with false per sec comparison 1 inv index ");
          std::ostream::operator<<(local_b8._M_head_impl + 0x10,local_ba);
          std::operator<<((ostream *)(local_b8._M_head_impl + 0x10),",");
          std::ostream::operator<<(local_b8._M_head_impl + 0x10,code);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__2,
                     (AssertionResult *)"cunit1 == cunit2adj","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x43c,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        bVar1 = units::precise_unit::operator==(&cunit1adj,(precise_unit *)&gtest_ar_);
        gtest_ar__2.success_ = !bVar1;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar__2.success_) {
          testing::Message::Message((Message *)&local_b8);
          std::operator<<((ostream *)(local_b8._M_head_impl + 0x10),
                          "Error with false per sec comparison 2 index ");
          std::ostream::operator<<(local_b8._M_head_impl + 0x10,local_ba);
          std::operator<<((ostream *)(local_b8._M_head_impl + 0x10),",");
          std::ostream::operator<<(local_b8._M_head_impl + 0x10,code);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__2,
                     (AssertionResult *)"cunit1adj == cunit2","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x43f,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        bVar1 = units::precise_unit::operator==(&cunit1adj,&cunit2adj);
        gtest_ar__2.success_ = !bVar1;
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar__2.success_) {
          testing::Message::Message((Message *)&local_b8);
          std::operator<<((ostream *)(local_b8._M_head_impl + 0x10),
                          "Error with false per sec comparison 2 per sec index ");
          std::ostream::operator<<(local_b8._M_head_impl + 0x10,local_ba);
          std::operator<<((ostream *)(local_b8._M_head_impl + 0x10),",");
          std::ostream::operator<<(local_b8._M_head_impl + 0x10,code);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__2,
                     (AssertionResult *)"cunit1adj == cunit2adj","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x442,(char *)gtest_ar._0_8_);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_b8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_b8._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
      }
      code = code + 1;
    }
    gtest_ar = (AssertionResult)
               units::precise_unit::operator*(&cunit1adj,(precise_unit *)units::precise::s);
    bVar1 = units::precise_unit::operator==((precise_unit *)&gtest_ar,&cunit1);
    gtest_ar_.success_ = bVar1;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&cunit2adj);
      std::operator<<((ostream *)((long)cunit2adj.multiplier_ + 0x10),
                      "Error with true per sec multiply");
      std::ostream::operator<<((void *)((long)cunit2adj.multiplier_ + 0x10),local_ba);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"cunit1adj * precise::s == cunit1","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x446,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&cunit2adj)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (cunit2adj.multiplier_ != 0.0) {
        (**(code **)(*(long *)cunit2adj.multiplier_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_ba = local_ba + 1;
  } while( true );
}

Assistant:

TEST(customUnits, uniquenesspersecond)
{
    for (std::uint16_t ii = 0; ii < 1024; ++ii) {
        auto cunit1 = precise::generate_custom_unit(ii);
        auto cunit1adj = cunit1 / precise::s;
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.inv().base_units()),
            ii);
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1.base_units()))
            << "Error with custom unit/s detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1adj.base_units()))
            << "Error with custom unit/s detection of inverse " << ii;
        for (std::uint16_t jj = 0; jj < 1024; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_unit(jj);
            auto cunit2adj = cunit2 / precise::s;
            EXPECT_FALSE(cunit1 == cunit2adj)
                << "Error with false per sec comparison 1 inv index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2)
                << "Error with false per sec comparison 2 index " << ii << ","
                << jj;
            EXPECT_FALSE(cunit1adj == cunit2adj)
                << "Error with false per sec comparison 2 per sec index " << ii
                << "," << jj;
        }
        EXPECT_TRUE(cunit1adj * precise::s == cunit1)
            << "Error with true per sec multiply" << ii;
    }
}